

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

bool __thiscall BCLog::Logger::StartLogging(Logger *this)

{
  list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_> *this_00;
  list<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
  *plVar1;
  long lVar2;
  string_view source_file;
  string_view logging_function;
  string_view threadname;
  uint __line;
  FILE *__stream;
  bool bVar3;
  char *__assertion;
  _List_node_base *p_Var4;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  string_view logging_function_00;
  string_view str_01;
  string_view source_file_00;
  string s;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  std::mutex::lock((mutex *)this);
  if (this->m_buffering == false) {
    __assertion = "m_buffering";
    __line = 0x37;
LAB_00637828:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/logging.cpp"
                  ,__line,"bool BCLog::Logger::StartLogging()");
  }
  if (this->m_fileout != (FILE *)0x0) {
    __assertion = "m_fileout == nullptr";
    __line = 0x38;
    goto LAB_00637828;
  }
  if (this->m_print_to_file == true) {
    if ((this->m_file_path).super_path._M_pathname._M_string_length == 0) {
      __assertion = "!m_file_path.empty()";
      __line = 0x3b;
      goto LAB_00637828;
    }
    __stream = fsbridge::fopen((char *)&this->m_file_path,"a");
    this->m_fileout = (FILE *)__stream;
    if (__stream == (FILE *)0x0) {
      bVar3 = false;
      goto LAB_006377ac;
    }
    setbuf(__stream,(char *)0x0);
    str._M_str = "\n\n\n\n\n";
    str._M_len = 5;
    FileWriteStr(str,this->m_fileout);
  }
  this->m_buffering = false;
  if (this->m_buffer_lines_discarded != 0) {
    tinyformat::format<unsigned_long>
              (&s,"Early logging buffer overflowed, %d log lines discarded.\n",
               &this->m_buffer_lines_discarded);
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/logging.cpp";
    source_file._M_len = 0x54;
    logging_function_00._M_str = "StartLogging";
    logging_function_00._M_len = 0xc;
    str_01._M_str = s._M_dataplus._M_p;
    str_01._M_len = s._M_string_length;
    LogPrintStr_(this,str_01,logging_function_00,source_file,0x4b,ALL,Info);
    std::__cxx11::string::~string((string *)&s);
  }
  this_00 = &this->m_msgs_before_open;
  plVar1 = &this->m_print_callbacks;
  while (p_Var4 = (this_00->
                  super__List_base<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>
                  )._M_impl._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)this_00) {
    std::__cxx11::string::string
              ((string *)&s,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var4 + 2));
    logging_function._M_str = (char *)p_Var4[4]._M_next;
    logging_function._M_len = (size_t)p_Var4[4]._M_prev;
    threadname._M_str = (char *)p_Var4[8]._M_next;
    threadname._M_len = (size_t)p_Var4[8]._M_prev;
    source_file_00._M_str = (char *)p_Var4[6]._M_next;
    source_file_00._M_len = (size_t)p_Var4[6]._M_prev;
    FormatLogStrInPlace(this,&s,(LogFlags)p_Var4[10]._M_prev,*(Level *)&p_Var4[0xb]._M_next,
                        source_file_00,*(int *)&p_Var4[10]._M_next,logging_function,threadname,
                        (time_point)p_Var4[1]._M_next,(seconds)p_Var4[1]._M_prev);
    std::__cxx11::list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>::
    pop_front(this_00);
    if (this->m_print_to_file == true) {
      str_00._M_str = s._M_dataplus._M_p;
      str_00._M_len = s._M_string_length;
      FileWriteStr(str_00,this->m_fileout);
    }
    p_Var4 = (_List_node_base *)plVar1;
    if (this->m_print_to_console == true) {
      fwrite(s._M_dataplus._M_p,1,s._M_string_length,_stdout);
    }
    while (p_Var4 = (((_List_base<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
                       *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var4 != (_List_node_base *)plVar1) {
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)(p_Var4 + 1),&s);
    }
    std::__cxx11::string::~string((string *)&s);
  }
  this->m_cur_buffer_memusage = 0;
  bVar3 = true;
  if (this->m_print_to_console == true) {
    fflush(_stdout);
  }
LAB_006377ac:
  pthread_mutex_unlock((pthread_mutex_t *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool BCLog::Logger::StartLogging()
{
    StdLockGuard scoped_lock(m_cs);

    assert(m_buffering);
    assert(m_fileout == nullptr);

    if (m_print_to_file) {
        assert(!m_file_path.empty());
        m_fileout = fsbridge::fopen(m_file_path, "a");
        if (!m_fileout) {
            return false;
        }

        setbuf(m_fileout, nullptr); // unbuffered

        // Add newlines to the logfile to distinguish this execution from the
        // last one.
        FileWriteStr("\n\n\n\n\n", m_fileout);
    }

    // dump buffered messages from before we opened the log
    m_buffering = false;
    if (m_buffer_lines_discarded > 0) {
        LogPrintStr_(strprintf("Early logging buffer overflowed, %d log lines discarded.\n", m_buffer_lines_discarded), __func__, __FILE__, __LINE__, BCLog::ALL, Level::Info);
    }
    while (!m_msgs_before_open.empty()) {
        const auto& buflog = m_msgs_before_open.front();
        std::string s{buflog.str};
        FormatLogStrInPlace(s, buflog.category, buflog.level, buflog.source_file, buflog.source_line, buflog.logging_function, buflog.threadname, buflog.now, buflog.mocktime);
        m_msgs_before_open.pop_front();

        if (m_print_to_file) FileWriteStr(s, m_fileout);
        if (m_print_to_console) fwrite(s.data(), 1, s.size(), stdout);
        for (const auto& cb : m_print_callbacks) {
            cb(s);
        }
    }
    m_cur_buffer_memusage = 0;
    if (m_print_to_console) fflush(stdout);

    return true;
}